

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::WriteFolderTargets(cmGlobalNinjaGenerator *this,ostream *os)

{
  pointer pcVar1;
  long *plVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  string *psVar8;
  const_iterator cVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var10;
  undefined4 extraout_var_01;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  pointer pbVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  pointer pbVar15;
  Target *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer pbVar16;
  key_type *pkVar17;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string buildDirAllTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmNinjaDeps configDeps;
  cmNinjaBuild build;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  dirTargets;
  undefined1 local_280 [24];
  char *local_268;
  string local_260;
  string local_240;
  ostream *local_220;
  _Base_ptr local_218;
  _Rb_tree_node_base *local_210;
  char *local_208;
  size_type local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  undefined8 uStack_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  _Rb_tree_node_base *local_1d0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c8;
  key_type *local_1c0;
  string local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  undefined1 local_180 [136];
  cmNinjaDeps local_f8 [3];
  _Rb_tree_node_base local_a8;
  size_t local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  local_60;
  ostream *os_00;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# =============================================================================\n",
             0x50);
  local_220 = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Folder targets.\n\n",0x13);
  cmGlobalCommonGenerator::ComputeDirectoryTargets_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
              *)&local_60,&this->super_cmGlobalCommonGenerator);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    local_1c8 = &this->CrossConfigs;
    local_218 = &(this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1d0 = &(this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_208 = &local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"phony","");
      local_180._0_8_ = local_180 + 0x10;
      local_180._8_8_ = 0;
      local_180[0x10] = '\0';
      local_180._32_8_ = local_180 + 0x30;
      if (local_208 == &local_1f8) {
        local_180._56_8_ = uStack_1f0;
      }
      else {
        local_180._32_8_ = local_208;
      }
      local_180._49_7_ = uStack_1f7;
      local_180[0x30] = local_1f8;
      local_180._40_8_ = local_200;
      local_200 = 0;
      local_1f8 = '\0';
      local_a8._M_color = _S_red;
      local_a8._M_parent = (_Base_ptr)0x0;
      local_208 = &local_1f8;
      memset(local_180 + 0x40,0,0x90);
      local_a8._M_left = &local_a8;
      local_88 = 0;
      local_80._M_p = (pointer)&local_70;
      local_78 = 0;
      local_70._M_local_buf[0] = '\0';
      local_a8._M_right = local_a8._M_left;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_220,
                 "# =============================================================================\n"
                 ,0x50);
      cmMakefile::GetGeneratorConfigs_abi_cxx11_
                (&local_1e8,*(cmMakefile **)(*(long *)(p_Var12 + 2) + 0x70),IncludeEmptyConfig);
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268 = *(char **)(p_Var12 + 1);
      local_280._16_8_ = p_Var12[1]._M_parent;
      local_280._0_8_ = (pointer)0x8;
      local_280._8_8_ = "Folder: ";
      views._M_len = 2;
      views._M_array = (iterator)local_280;
      cmCatViews_abi_cxx11_(&local_240,views);
      std::__cxx11::string::operator=((string *)local_180,(string *)&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_180 + 0x40));
      local_280._8_8_ = *(undefined8 *)(p_Var12 + 1);
      local_280._0_8_ = p_Var12[1]._M_parent;
      local_280._16_8_ = 4;
      local_268 = "/all";
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_280;
      cmCatViews_abi_cxx11_(&local_260,views_00);
      psVar8 = ConvertToNinjaPath(this,&local_260);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      pcVar1 = (psVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar1,pcVar1 + psVar8->_M_string_length);
      local_210 = p_Var12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      local_1c0 = local_1e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pbVar16 = local_1e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pbVar15 = local_f8[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pbVar5 = local_f8[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_f8[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_f8[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar14 = &(local_f8[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar14 + -1))->_M_dataplus)._M_p;
              if (paVar14 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar2) {
                operator_delete(plVar2,paVar14->_M_allocated_capacity + 1);
              }
              pbVar13 = (pointer)(paVar14 + 1);
              paVar14 = paVar14 + 2;
            } while (pbVar13 != pbVar15);
            local_f8[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
          }
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x48])((string *)local_280,this,&local_240);
          std::__cxx11::string::operator=((string *)local_180._64_8_,(string *)local_280);
          if ((_Base_ptr)local_280._0_8_ != (_Base_ptr)(local_280 + 0x10)) {
            operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_180._64_8_);
          p_Var3 = local_210[2]._M_left;
          for (p_Var12 = local_210[2]._M_parent; p_Var12 != p_Var3; p_Var12 = p_Var12 + 1) {
            bVar6 = cmGlobalCommonGenerator::IsExcludedFromAllInConfig
                              (&this->super_cmGlobalCommonGenerator,(Target *)p_Var12,pbVar16);
            if (!bVar6) {
              AppendTargetOutputs(this,*(cmGeneratorTarget **)p_Var12,local_f8,pbVar16,
                                  DependOnTargetArtifact);
            }
          }
          p_Var3 = local_210[3]._M_parent;
          for (p_Var12 = *(_Base_ptr *)(local_210 + 3); p_Var12 != p_Var3;
              p_Var12 = (_Base_ptr)&p_Var12[1]._M_parent) {
            if ((char)p_Var12[1]._M_color == _S_red) {
              local_280._8_8_ = *(undefined8 *)p_Var12;
              local_280._0_8_ = p_Var12->_M_parent;
              local_280._16_8_ = 4;
              local_268 = "/all";
              views_01._M_len = 2;
              views_01._M_array = (iterator)local_280;
              cmCatViews_abi_cxx11_(&local_1b8,views_01);
              psVar8 = ConvertToNinjaPath(this,&local_1b8);
              (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x48])(&local_260,this,psVar8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_f8,&local_260);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                operator_delete(local_1b8._M_dataplus._M_p,
                                local_1b8.field_2._M_allocated_capacity + 1);
              }
            }
          }
          if (((this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (cVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_1c8->_M_t,pbVar16), os_00 = local_220,
             cVar9._M_node == local_218)) {
            iVar7 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      _vptr_cmGlobalGenerator[0x41])(this,pbVar16);
            os_00 = (ostream *)CONCAT44(extraout_var,iVar7);
          }
          WriteBuild(this,os_00,(cmNinjaBuild *)local_180,0,(bool *)0x0);
          pbVar16 = pbVar16 + 1;
        } while (pbVar16 != local_1c0);
      }
      iVar7 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x26])(this);
      pbVar16 = local_1e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      p_Var12 = (_Base_ptr)(local_280 + 0x10);
      pkVar17 = local_1e8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((char)iVar7 != '\0') {
        for (; pbVar15 = local_f8[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
            pbVar5 = local_f8[0].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, pkVar17 != pbVar16;
            pkVar17 = pkVar17 + 1) {
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x48])(local_280,this,&local_240);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_f8,
                     local_280,&local_260);
          if ((_Base_ptr)local_280._0_8_ != p_Var12) {
            operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
          }
          std::__cxx11::string::_M_assign((string *)local_180._64_8_);
          iVar7 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x42])(this,pkVar17);
          WriteBuild(this,(ostream *)CONCAT44(extraout_var_00,iVar7),(cmNinjaBuild *)local_180,0,
                     (bool *)0x0);
        }
        if ((this->DefaultFileConfig)._M_string_length != 0) {
          if (local_f8[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_f8[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar14 = &(local_f8[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar14 + -1))->_M_dataplus)._M_p;
              if (paVar14 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar2) {
                operator_delete(plVar2,paVar14->_M_allocated_capacity + 1);
              }
              pbVar16 = (pointer)(paVar14 + 1);
              paVar14 = paVar14 + 2;
            } while (pbVar16 != pbVar15);
            local_f8[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
          }
          p_Var4 = local_1d0;
          for (p_Var10 = (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
              ; p_Var10 != p_Var4; p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10))
          {
            (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x48])((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280
                      ,this,&local_240);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_f8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_280);
            if ((_Base_ptr)local_280._0_8_ != p_Var12) {
              operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
            }
          }
          std::__cxx11::string::_M_assign((string *)local_180._64_8_);
          iVar7 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x43])(this);
          WriteBuild(this,(ostream *)CONCAT44(extraout_var_01,iVar7),(cmNinjaBuild *)local_180,0,
                     (bool *)0x0);
        }
      }
      pbVar5 = local_f8[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar16 = local_f8[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        if (local_f8[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_f8[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar14 = &(local_f8[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar14 + -1))->_M_dataplus)._M_p;
            if (paVar14 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar14->_M_allocated_capacity + 1);
            }
            pbVar15 = (pointer)(paVar14 + 1);
            paVar14 = paVar14 + 2;
          } while (pbVar15 != pbVar5);
          local_f8[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar16;
        }
        p_Var11 = (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (p_Var11 != local_218) {
          do {
            (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x48])((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280
                      ,this,&local_240,p_Var11 + 1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_f8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_280);
            if ((_Base_ptr)local_280._0_8_ != p_Var12) {
              operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
            }
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          } while (p_Var11 != local_218);
        }
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"all","");
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x48])((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                  this,&local_240);
        std::__cxx11::string::operator=((string *)local_180._64_8_,(string *)local_280);
        if ((_Base_ptr)local_280._0_8_ != p_Var12) {
          operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        WriteBuild(this,local_220,(cmNinjaBuild *)local_180,0,(bool *)0x0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1e8);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_180);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(local_210);
    } while ((_Rb_tree_header *)p_Var12 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteFolderTargets(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Folder targets.\n\n";

  std::map<std::string, DirectoryTarget> dirTargets =
    this->ComputeDirectoryTargets();

  for (auto const& it : dirTargets) {
    cmNinjaBuild build("phony");
    cmGlobalNinjaGenerator::WriteDivider(os);
    std::string const& currentBinaryDir = it.first;
    DirectoryTarget const& dt = it.second;
    std::vector<std::string> configs =
      dt.LG->GetMakefile()->GetGeneratorConfigs(
        cmMakefile::IncludeEmptyConfig);

    // Setup target
    cmNinjaDeps configDeps;
    build.Comment = cmStrCat("Folder: ", currentBinaryDir);
    build.Outputs.emplace_back();
    std::string const buildDirAllTarget =
      this->ConvertToNinjaPath(cmStrCat(currentBinaryDir, "/all"));
    for (auto const& config : configs) {
      build.ExplicitDeps.clear();
      build.Outputs.front() = this->BuildAlias(buildDirAllTarget, config);
      configDeps.emplace_back(build.Outputs.front());
      for (DirectoryTarget::Target const& t : dt.Targets) {
        if (!this->IsExcludedFromAllInConfig(t, config)) {
          this->AppendTargetOutputs(t.GT, build.ExplicitDeps, config,
                                    DependOnTargetArtifact);
        }
      }
      for (DirectoryTarget::Dir const& d : dt.Children) {
        if (!d.ExcludeFromAll) {
          build.ExplicitDeps.emplace_back(this->BuildAlias(
            this->ConvertToNinjaPath(cmStrCat(d.Path, "/all")), config));
        }
      }
      // Write target
      this->WriteBuild(this->EnableCrossConfigBuild() &&
                           this->CrossConfigs.count(config)
                         ? os
                         : *this->GetImplFileStream(config),
                       build);
    }

    // Add shortcut target
    if (this->IsMultiConfig()) {
      for (auto const& config : configs) {
        build.ExplicitDeps = { this->BuildAlias(buildDirAllTarget, config) };
        build.Outputs.front() = buildDirAllTarget;
        this->WriteBuild(*this->GetConfigFileStream(config), build);
      }

      if (!this->DefaultFileConfig.empty()) {
        build.ExplicitDeps.clear();
        for (auto const& config : this->DefaultConfigs) {
          build.ExplicitDeps.push_back(
            this->BuildAlias(buildDirAllTarget, config));
        }
        build.Outputs.front() = buildDirAllTarget;
        this->WriteBuild(*this->GetDefaultFileStream(), build);
      }
    }

    // Add target for all configs
    if (this->EnableCrossConfigBuild()) {
      build.ExplicitDeps.clear();
      for (auto const& config : this->CrossConfigs) {
        build.ExplicitDeps.push_back(
          this->BuildAlias(buildDirAllTarget, config));
      }
      build.Outputs.front() = this->BuildAlias(buildDirAllTarget, "all");
      this->WriteBuild(os, build);
    }
  }
}